

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O3

int mbedtls_x509write_crt_set_basic_constraints
              (mbedtls_x509write_cert *ctx,int is_ca,int max_pathlen)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  uchar *c;
  uchar buf [9];
  uchar *local_38;
  uchar local_30 [16];
  
  puVar1 = local_30 + 9;
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = 0;
  uVar2 = 0xffffd800;
  if (is_ca == 0 || max_pathlen < 0x80) {
    local_38 = puVar1;
    if (is_ca == 0) {
      sVar5 = 0;
    }
    else {
      if (max_pathlen < 0) {
        uVar4 = 0;
      }
      else {
        uVar2 = mbedtls_asn1_write_int(&local_38,local_30,max_pathlen);
        if ((int)uVar2 < 0) {
          return uVar2;
        }
        uVar4 = (ulong)uVar2;
      }
      uVar2 = mbedtls_asn1_write_bool(&local_38,local_30,1);
      if ((int)uVar2 < 0) {
        return uVar2;
      }
      sVar5 = uVar4 + uVar2;
    }
    uVar3 = mbedtls_asn1_write_len(&local_38,local_30,sVar5);
    uVar2 = uVar3;
    if ((-1 < (int)uVar3) &&
       (uVar2 = mbedtls_asn1_write_tag(&local_38,local_30,'0'), -1 < (int)uVar2)) {
      sVar5 = (ulong)uVar2 + sVar5 + uVar3;
      uVar2 = mbedtls_x509_set_extension(&ctx->extensions,"U\x1d\x13",3,0,puVar1 + -sVar5,sVar5);
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_x509write_crt_set_basic_constraints( mbedtls_x509write_cert *ctx,
                                         int is_ca, int max_pathlen )
{
    int ret;
    unsigned char buf[9];
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );

    if( is_ca && max_pathlen > 127 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    if( is_ca )
    {
        if( max_pathlen >= 0 )
        {
            MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, max_pathlen ) );
        }
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_bool( &c, buf, 1 ) );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_BASIC_CONSTRAINTS,
                                        MBEDTLS_OID_SIZE( MBEDTLS_OID_BASIC_CONSTRAINTS ),
                                        0, buf + sizeof(buf) - len, len );
}